

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder_context.h
# Opt level: O3

void __thiscall mocker::ir::BuilderContext::checkLogicalExpr(BuilderContext *this,Expression *node)

{
  _List_node_base *p_Var1;
  shared_ptr<mocker::ir::Label> local_58;
  undefined1 local_48 [24];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_30;
  
  if ((this->logicalExprInfo).empty == false) {
    getExprAddr((BuilderContext *)local_48,(NodeID)this);
    p_Var1 = (this->logicalExprInfo).trueNext._M_node[1]._M_next;
    local_58.super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x20);
    (local_58.super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
    _M_use_count = 1;
    (local_58.super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
    _M_weak_count = 1;
    (local_58.super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
    _vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_001e8af0;
    local_58.super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)
         (local_58.super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi + 1);
    local_58.super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
    _vptr__Sp_counted_base = (_func_int **)&PTR__Addr_001e8b68;
    *(_List_node_base **)
     &local_58.super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      [1]._M_use_count = p_Var1;
    p_Var1 = (this->logicalExprInfo).falseNext._M_node[1]._M_next;
    local_30 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x20);
    local_30->_M_use_count = 1;
    local_30->_M_weak_count = 1;
    local_30->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_001e8af0;
    local_48._16_8_ = local_30 + 1;
    local_30[1]._vptr__Sp_counted_base = (_func_int **)&PTR__Addr_001e8b68;
    *(_List_node_base **)&local_30[1]._M_use_count = p_Var1;
    emplaceInst<mocker::ir::Branch,std::shared_ptr<mocker::ir::Addr>,std::shared_ptr<mocker::ir::Label>,std::shared_ptr<mocker::ir::Label>>
              (this,(shared_ptr<mocker::ir::Addr> *)local_48,&local_58,
               (shared_ptr<mocker::ir::Label> *)(local_48 + 0x10));
    if (local_30 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_30);
    }
    if (local_58.super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_58.super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48._8_8_);
    }
  }
  return;
}

Assistant:

void checkLogicalExpr(const ast::Expression &node) {
    if (logicalExprInfo.empty)
      return;
    emplaceInst<Branch>(
        getExprAddr(node.getID()),
        std::make_shared<Label>(logicalExprInfo.trueNext->getLabelID()),
        std::make_shared<Label>(logicalExprInfo.falseNext->getLabelID()));
  }